

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

bool divsufsortxx::helper::
     partition<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (iterator Td,iterator first1,iterator first2,iterator last,iterator *mfirst,
               iterator *mlast,value_type *v)

{
  iterator __b;
  iterator __b_00;
  iterator __b_01;
  iterator __b_02;
  iterator __b_03;
  iterator first2_00;
  iterator first2_01;
  iterator __a;
  iterator __a_00;
  iterator __a_01;
  iterator __a_02;
  iterator __a_03;
  iterator last1;
  iterator last1_00;
  iterator first1_00;
  iterator first1_01;
  bool bVar1;
  bool bVar2;
  iterator *piVar3;
  difference_type dVar4;
  pos_type in_RCX;
  BitmapArray<long> *in_RDX;
  iterator *in_stack_00000018;
  iterator *in_stack_00000020;
  long *in_stack_00000028;
  value_type x;
  iterator d;
  iterator c;
  iterator b;
  iterator a;
  iterator *in_stack_fffffffffffffd48;
  undefined2 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd52;
  undefined1 in_stack_fffffffffffffd53;
  undefined1 in_stack_fffffffffffffd54;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 uVar6;
  iterator *it;
  BitmapArray<long> *in_stack_fffffffffffffd60;
  BitmapArray<long> *in_stack_fffffffffffffd68;
  BitmapArray<long> *in_stack_fffffffffffffd70;
  BitmapArray<long> *in_stack_fffffffffffffd78;
  BitmapArray<long> *in_stack_fffffffffffffd80;
  BitmapArray<long> *in_stack_fffffffffffffd88;
  pos_type in_stack_fffffffffffffd90;
  long local_250;
  iterator local_248;
  difference_type local_238;
  iterator local_230;
  BitmapArray<long> *local_220;
  pos_type local_218;
  BitmapArray<long> *local_210;
  pos_type local_208;
  difference_type local_200;
  difference_type local_1f8;
  iterator local_1f0;
  iterator local_1e0;
  BitmapArray<long> *local_1d0;
  pos_type local_1c8;
  reference local_1c0;
  reference local_1b0;
  iterator local_1a0;
  BitmapArray<long> *local_190;
  pos_type local_188;
  reference local_180;
  reference local_170;
  BitmapArray<long> *local_160;
  pos_type local_158;
  BitmapArray<long> *local_150;
  pos_type local_148;
  iterator local_140;
  BitmapArray<long> *local_130;
  pos_type local_128;
  reference local_120;
  reference local_110;
  reference local_100;
  reference local_f0;
  iterator local_e0;
  BitmapArray<long> *local_d0;
  pos_type local_c8;
  reference local_c0;
  reference local_b0;
  reference local_a0;
  reference local_90;
  long local_80;
  iterator local_78;
  iterator local_68;
  iterator local_58;
  iterator local_48;
  iterator local_38;
  iterator local_28 [2];
  
  it = (iterator *)&stack0x00000008;
  local_28[0].array_ = in_RDX;
  local_28[0].pos_ = in_RCX;
  bitmap::BitmapArray<long>::iterator::iterator(&local_48);
  bitmap::BitmapArray<long>::iterator::iterator(&local_58);
  bitmap::BitmapArray<long>::iterator::iterator(&local_68);
  bitmap::BitmapArray<long>::iterator::iterator(&local_78);
  local_80 = 0;
  bitmap::BitmapArray<long>::iterator::operator=(&local_58,&local_38);
  while( true ) {
    bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_58,it);
    uVar6 = false;
    if (bVar1) {
      local_a0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12643f);
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12645c);
      local_90 = bitmap::BitmapArray<long>::iterator::operator[]
                           ((iterator *)in_stack_fffffffffffffd60,(difference_type)it);
      local_80 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                           ((value_reference *)0x126489);
      uVar6 = local_80 == *in_stack_00000028;
    }
    if ((bool)uVar6 == false) break;
    bitmap::BitmapArray<long>::iterator::operator++(&local_58);
  }
  piVar3 = bitmap::BitmapArray<long>::iterator::operator=(&local_48,&local_58);
  bVar1 = bitmap::BitmapArray<long>::iterator::operator<(piVar3,it);
  if ((bVar1) && (local_80 < *in_stack_00000028)) {
    while( true ) {
      piVar3 = bitmap::BitmapArray<long>::iterator::operator++(&local_58);
      bVar2 = bitmap::BitmapArray<long>::iterator::operator<(piVar3,it);
      bVar1 = false;
      if (bVar2) {
        local_c0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12653d);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12655a);
        local_b0 = bitmap::BitmapArray<long>::iterator::operator[]
                             ((iterator *)in_stack_fffffffffffffd60,(difference_type)it);
        local_80 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                             ((value_reference *)0x126587);
        bVar1 = local_80 <= *in_stack_00000028;
      }
      if (!bVar1) break;
      if (local_80 == *in_stack_00000028) {
        local_d0 = local_58.array_;
        local_c8 = local_58.pos_;
        local_e0 = bitmap::BitmapArray<long>::iterator::operator++(in_stack_fffffffffffffd48,0);
        __a.pos_ = (pos_type)in_stack_fffffffffffffd80;
        __a.array_ = in_stack_fffffffffffffd78;
        __b.pos_ = (pos_type)in_stack_fffffffffffffd70;
        __b.array_ = in_stack_fffffffffffffd68;
        std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (__a,__b);
      }
    }
    in_stack_fffffffffffffd56 = 0;
  }
  bitmap::BitmapArray<long>::iterator::operator=(&local_68,it);
  do {
    piVar3 = bitmap::BitmapArray<long>::iterator::operator--(&local_68);
    bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_58,piVar3);
    uVar5 = false;
    if (bVar1) {
      local_100 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x126676);
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x126693);
      local_f0 = bitmap::BitmapArray<long>::iterator::operator[]
                           ((iterator *)in_stack_fffffffffffffd60,(difference_type)it);
      local_80 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                           ((value_reference *)0x1266c0);
      uVar5 = local_80 == *in_stack_00000028;
    }
  } while ((bool)uVar5 != false);
  piVar3 = bitmap::BitmapArray<long>::iterator::operator=(&local_78,&local_68);
  bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_58,piVar3);
  if ((bVar1) && (*in_stack_00000028 < local_80)) {
    while( true ) {
      piVar3 = bitmap::BitmapArray<long>::iterator::operator--(&local_68);
      bVar2 = bitmap::BitmapArray<long>::iterator::operator<(&local_58,piVar3);
      bVar1 = false;
      if (bVar2) {
        local_120 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12676b);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x126788);
        local_110 = bitmap::BitmapArray<long>::iterator::operator[]
                              ((iterator *)in_stack_fffffffffffffd60,(difference_type)it);
        local_80 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                             ((value_reference *)0x1267b5);
        bVar1 = *in_stack_00000028 <= local_80;
      }
      if (!bVar1) break;
      if (local_80 == *in_stack_00000028) {
        local_130 = local_68.array_;
        local_128 = local_68.pos_;
        local_140 = bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffffd48,0);
        __a_00.pos_ = (pos_type)in_stack_fffffffffffffd80;
        __a_00.array_ = in_stack_fffffffffffffd78;
        __b_00.pos_ = (pos_type)in_stack_fffffffffffffd70;
        __b_00.array_ = in_stack_fffffffffffffd68;
        std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (__a_00,__b_00);
      }
    }
    in_stack_fffffffffffffd54 = 0;
  }
  while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_58,&local_68), bVar1) {
    local_150 = local_58.array_;
    local_148 = local_58.pos_;
    local_160 = local_68.array_;
    local_158 = local_68.pos_;
    __a_01.pos_ = (pos_type)in_stack_fffffffffffffd80;
    __a_01.array_ = in_stack_fffffffffffffd78;
    __b_01.pos_ = (pos_type)in_stack_fffffffffffffd70;
    __b_01.array_ = in_stack_fffffffffffffd68;
    std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (__a_01,__b_01);
    while( true ) {
      piVar3 = bitmap::BitmapArray<long>::iterator::operator++(&local_58);
      bVar2 = bitmap::BitmapArray<long>::iterator::operator<(piVar3,&local_68);
      bVar1 = false;
      if (bVar2) {
        local_180 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x126917);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x126934);
        local_170 = bitmap::BitmapArray<long>::iterator::operator[]
                              ((iterator *)in_stack_fffffffffffffd60,(difference_type)it);
        local_80 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                             ((value_reference *)0x126961);
        bVar1 = local_80 <= *in_stack_00000028;
      }
      if (!bVar1) break;
      if (local_80 == *in_stack_00000028) {
        local_190 = local_58.array_;
        local_188 = local_58.pos_;
        local_1a0 = bitmap::BitmapArray<long>::iterator::operator++(in_stack_fffffffffffffd48,0);
        __a_02.pos_ = (pos_type)in_stack_fffffffffffffd80;
        __a_02.array_ = in_stack_fffffffffffffd78;
        __b_02.pos_ = (pos_type)in_stack_fffffffffffffd70;
        __b_02.array_ = in_stack_fffffffffffffd68;
        std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (__a_02,__b_02);
      }
    }
    in_stack_fffffffffffffd53 = 0;
    while( true ) {
      piVar3 = bitmap::BitmapArray<long>::iterator::operator--(&local_68);
      bVar2 = bitmap::BitmapArray<long>::iterator::operator<(&local_58,piVar3);
      bVar1 = false;
      if (bVar2) {
        local_1c0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x126a3e);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x126a5b);
        local_1b0 = bitmap::BitmapArray<long>::iterator::operator[]
                              ((iterator *)in_stack_fffffffffffffd60,(difference_type)it);
        local_80 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                             ((value_reference *)0x126a88);
        bVar1 = *in_stack_00000028 <= local_80;
      }
      if (!bVar1) break;
      if (local_80 == *in_stack_00000028) {
        local_1d0 = local_68.array_;
        local_1c8 = local_68.pos_;
        local_1e0 = bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffffd48,0);
        __a_03.pos_ = (pos_type)in_stack_fffffffffffffd80;
        __a_03.array_ = in_stack_fffffffffffffd78;
        __b_03.pos_ = (pos_type)in_stack_fffffffffffffd70;
        __b_03.array_ = in_stack_fffffffffffffd68;
        std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (__a_03,__b_03);
      }
    }
    in_stack_fffffffffffffd52 = 0;
  }
  bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                    ((iterator *)
                     CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd56,
                                             CONCAT15(uVar5,CONCAT14(in_stack_fffffffffffffd54,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffd53,
                                                  CONCAT12(in_stack_fffffffffffffd52,
                                                           in_stack_fffffffffffffd50)))))),
                     in_stack_fffffffffffffd48);
  if (bVar1) {
    local_1f8 = bitmap::BitmapArray<long>::iterator::operator-(&local_48,local_28);
    local_200 = bitmap::BitmapArray<long>::iterator::operator-(&local_58,&local_48);
    std::min<long>(&local_1f8,&local_200);
    local_1f0 = bitmap::BitmapArray<long>::iterator::operator-
                          (it,CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd56,
                                                      CONCAT15(uVar5,CONCAT14(
                                                  in_stack_fffffffffffffd54,
                                                  CONCAT13(in_stack_fffffffffffffd53,
                                                           CONCAT12(in_stack_fffffffffffffd52,
                                                                    in_stack_fffffffffffffd50)))))))
    ;
    local_210 = local_58.array_;
    local_208 = local_58.pos_;
    local_220 = local_28[0].array_;
    local_218 = local_28[0].pos_;
    first1_00.pos_ = in_stack_fffffffffffffd90;
    first1_00.array_ = in_stack_fffffffffffffd88;
    last1.pos_ = (pos_type)in_stack_fffffffffffffd80;
    last1.array_ = in_stack_fffffffffffffd78;
    first2_00.pos_ = (pos_type)in_stack_fffffffffffffd70;
    first2_00.array_ = in_stack_fffffffffffffd68;
    vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (first1_00,last1,first2_00);
    local_248 = bitmap::BitmapArray<long>::iterator::operator+
                          (it,CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd56,
                                                      CONCAT15(uVar5,CONCAT14(
                                                  in_stack_fffffffffffffd54,
                                                  CONCAT13(in_stack_fffffffffffffd53,
                                                           CONCAT12(in_stack_fffffffffffffd52,
                                                                    in_stack_fffffffffffffd50)))))))
    ;
    local_238 = bitmap::BitmapArray<long>::iterator::operator-(&local_248,&local_58);
    dVar4 = bitmap::BitmapArray<long>::iterator::operator-(it,&local_78);
    local_250 = dVar4 + -1;
    std::min<long>(&local_238,&local_250);
    local_230 = bitmap::BitmapArray<long>::iterator::operator-
                          (it,CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd56,
                                                      CONCAT15(uVar5,CONCAT14(
                                                  in_stack_fffffffffffffd54,
                                                  CONCAT13(in_stack_fffffffffffffd53,
                                                           CONCAT12(in_stack_fffffffffffffd52,
                                                                    in_stack_fffffffffffffd50)))))))
    ;
    first1_01.pos_ = (pos_type)local_58.array_;
    first1_01.array_ = in_stack_fffffffffffffd88;
    last1_00.pos_ = (pos_type)in_stack_fffffffffffffd80;
    last1_00.array_ = in_stack_fffffffffffffd78;
    first2_01.pos_ = (pos_type)in_stack_fffffffffffffd70;
    first2_01.array_ = in_stack_fffffffffffffd68;
    vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (first1_01,last1_00,first2_01);
    bitmap::BitmapArray<long>::iterator::operator-(&local_58,&local_48);
    bitmap::BitmapArray<long>::iterator::operator+
              (it,CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd56,
                                          CONCAT15(uVar5,CONCAT14(in_stack_fffffffffffffd54,
                                                                  CONCAT13(in_stack_fffffffffffffd53
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffd52,
                                                  in_stack_fffffffffffffd50)))))));
    bitmap::BitmapArray<long>::iterator::operator=
              (in_stack_00000018,(iterator *)&stack0xfffffffffffffd80);
    bitmap::BitmapArray<long>::iterator::operator+
              (it,CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd56,
                                          CONCAT15(uVar5,CONCAT14(in_stack_fffffffffffffd54,
                                                                  CONCAT13(in_stack_fffffffffffffd53
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffd52,
                                                  in_stack_fffffffffffffd50)))))));
    bitmap::BitmapArray<long>::iterator::operator-((iterator *)&stack0xfffffffffffffd60,&local_58);
    bitmap::BitmapArray<long>::iterator::operator-
              (it,CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd56,
                                          CONCAT15(uVar5,CONCAT14(in_stack_fffffffffffffd54,
                                                                  CONCAT13(in_stack_fffffffffffffd53
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffd52,
                                                  in_stack_fffffffffffffd50)))))));
    bitmap::BitmapArray<long>::iterator::operator=
              (in_stack_00000020,(iterator *)&stack0xfffffffffffffd70);
  }
  else {
    bitmap::BitmapArray<long>::iterator::operator=(in_stack_00000018,local_28);
    bitmap::BitmapArray<long>::iterator::operator=(in_stack_00000020,it);
  }
  return bVar1;
}

Assistant:

bool partition(
    const StringIterator_type Td, SAIterator_type first1,
    SAIterator_type first2, SAIterator_type last, SAIterator_type &mfirst,
    SAIterator_type &mlast,
    const typename std::iterator_traits<StringIterator_type>::value_type &v) {
  SAIterator_type a, b, c, d;
  typename std::iterator_traits<StringIterator_type>::value_type x = 0;

  for (b = first2; (b < last) && ((x = Td[*b]) == v); ++b) {
  }
  if (((a = b) < last) && (x < v)) {
    for (; (++b < last) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
  }
  for (c = last; (b < --c) && ((x = Td[*c]) == v);) {
  }
  if ((b < (d = c)) && (x > v)) {
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }
  for (; b < c;) {
    std::iter_swap(b, c);
    for (; (++b < c) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }

  if (a <= d) {
    vecswap(b - std::min(a - first1, b - a), b, first1);
    vecswap(last - std::min(d + 1 - b, last - d - 1), last, b);
    mfirst = first1 + (b - a), mlast = last - (d + 1 - b);
    return true;
  }
  mfirst = first1, mlast = last;
  return false;
}